

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsFile.cpp
# Opt level: O3

void __thiscall AdsFile::Write(AdsFile *this,size_t size,void *data)

{
  long adsErrorCode;
  AdsException *this_00;
  
  adsErrorCode = AdsDevice::ReadWriteReqEx2
                           (this->m_Route,0x7b,
                            *(this->m_Handle)._M_t.
                             super___uniq_ptr_impl<unsigned_int,_ResourceDeleter<unsigned_int>_>.
                             _M_t.
                             super__Tuple_impl<0UL,_unsigned_int_*,_ResourceDeleter<unsigned_int>_>.
                             super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl,0,(void *)0x0
                            ,size,data,(uint32_t *)0x0);
  if (adsErrorCode == 0) {
    return;
  }
  this_00 = (AdsException *)__cxa_allocate_exception(0x30);
  AdsException::AdsException(this_00,adsErrorCode);
  __cxa_throw(this_00,&AdsException::typeinfo,AdsException::~AdsException);
}

Assistant:

void AdsFile::Write(const size_t size, const void* data) const
{
    auto error = m_Route.ReadWriteReqEx2(SYSTEMSERVICE_FWRITE, *m_Handle, 0, nullptr, size, data, nullptr);
    if (error) {
        throw AdsException(error);
    }
}